

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O3

int JsFgets(char *buf,int size,PAL_FILE *file)

{
  int c;
  ulong uVar1;
  uint uVar2;
  bool bVar3;
  
  uVar2 = size - 1;
  if ((int)uVar2 < 0) {
    uVar2 = 0xffffffff;
  }
  else {
    if (uVar2 == 0) {
      uVar2 = 0;
    }
    else {
      uVar1 = 0;
      bVar3 = false;
      do {
        c = PAL_getc(file);
        if (c == -1) {
LAB_00111dd0:
          uVar2 = (uint)uVar1;
          break;
        }
        buf[uVar1] = (char)c;
        if (c == 10) {
          uVar1 = (ulong)((int)uVar1 + 1);
          goto LAB_00111dd0;
        }
        if (bVar3) {
          PAL_ungetc(c,file);
          goto LAB_00111dd0;
        }
        bVar3 = c == 0xd;
        uVar1 = uVar1 + 1;
      } while (uVar2 != uVar1);
    }
    buf[(int)uVar2] = '\0';
  }
  return uVar2;
}

Assistant:

int JsFgets(char* buf, int size, FILE* file)
{
    int n = size - 1;
    if (n < 0)
        return -1;

    bool crflag = false;
    int c, i = 0;

    for (i = 0; i < n && (c = getc(file)) != EOF; i++) {
        buf[i] = (char)c;
        if (c == '\n') {        // any \n ends a line
            i++;                // keep the \n; we know there is room for \0
            break;
        }
        if (crflag) {           // \r not followed by \n ends line at the \r
            ungetc(c, file);
            break;              // and overwrite c in buf with \0
        }
        crflag = (c == '\r');
    }

    buf[i] = '\0';
    return i;
}